

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reopen.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  GLuint GVar5;
  GLuint GVar6;
  GLuint GVar7;
  GLint GVar8;
  time_t tVar9;
  GLFWmonitor **ppGVar10;
  GLFWvidmode *pGVar11;
  GLFWwindow *handle;
  char *pcVar12;
  float *pfVar13;
  uint *puVar14;
  int i;
  long lVar15;
  long lVar16;
  long lVar17;
  GLFWmonitor *handle_00;
  float fVar18;
  double dVar19;
  int iVar20;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  int height;
  int width;
  GLuint vertex_buffer;
  mat4x4 mvp;
  int monitorCount;
  mat4x4 m;
  int local_154;
  int local_150;
  GLuint local_14c;
  undefined1 local_148 [16];
  float local_138;
  undefined4 uStack_134;
  undefined8 uStack_130;
  ulong local_128;
  undefined1 auStack_120 [16];
  undefined4 local_110;
  undefined4 local_10c;
  undefined8 uStack_108;
  undefined4 uStack_100;
  undefined4 local_fc;
  float local_f8 [2];
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  float local_b8;
  undefined8 local_b4;
  undefined8 uStack_ac;
  undefined1 local_a4 [16];
  undefined8 local_94;
  undefined4 local_8c;
  float local_88;
  undefined8 local_84;
  undefined4 local_7c;
  uint local_78 [2];
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  tVar9 = time((time_t *)0x0);
  srand((uint)tVar9);
  glfwSetErrorCallback(error_callback);
  iVar3 = glfwInit();
  if (iVar3 == 0) {
LAB_00113b70:
    exit(1);
  }
  glfwWindowHint(0x22002,2);
  glfwWindowHint(0x22003,0);
  bVar2 = 0;
  do {
    iVar3 = 0x280;
    iVar20 = 0x1e0;
    if ((bool)(bVar2 & 1)) {
      ppGVar10 = glfwGetMonitors((int *)local_f8);
      iVar4 = rand();
      handle_00 = ppGVar10[iVar4 % (int)local_f8[0]];
      if (handle_00 == (GLFWmonitor *)0x0) goto LAB_00113bf2;
      pGVar11 = glfwGetVideoMode(handle_00);
      iVar3 = pGVar11->width;
      iVar20 = pGVar11->height;
      bVar1 = false;
    }
    else {
LAB_00113bf2:
      bVar1 = true;
      handle_00 = (GLFWmonitor *)0x0;
    }
    dVar19 = glfwGetTime();
    local_148._0_8_ = dVar19;
    handle = glfwCreateWindow(iVar3,iVar20,"Window Re-opener",handle_00,(GLFWwindow *)0x0);
    if (handle == (GLFWwindow *)0x0) {
      glfwTerminate();
      goto LAB_00113b70;
    }
    if (bVar1) {
      dVar19 = glfwGetTime();
      printf("Opening regular window took %0.3f seconds\n",dVar19 - (double)local_148._0_8_);
    }
    else {
      pcVar12 = glfwGetMonitorName(handle_00);
      dVar19 = glfwGetTime();
      printf("Opening full screen window on monitor %s took %0.3f seconds\n",
             dVar19 - (double)local_148._0_8_,pcVar12);
    }
    glfwSetWindowCloseCallback(handle,window_close_callback);
    glfwSetKeyCallback(handle,key_callback);
    glfwMakeContextCurrent(handle);
    gladLoadGLLoader(glfwGetProcAddress);
    glfwSwapInterval(1);
    GVar5 = (*glad_glCreateShader)(0x8b31);
    (*glad_glShaderSource)(GVar5,1,&vertex_shader_text,(GLint *)0x0);
    (*glad_glCompileShader)(GVar5);
    GVar6 = (*glad_glCreateShader)(0x8b30);
    (*glad_glShaderSource)(GVar6,1,&fragment_shader_text,(GLint *)0x0);
    (*glad_glCompileShader)(GVar6);
    GVar7 = (*glad_glCreateProgram)();
    (*glad_glAttachShader)(GVar7,GVar5);
    (*glad_glAttachShader)(GVar7,GVar6);
    (*glad_glLinkProgram)(GVar7);
    GVar8 = (*glad_glGetUniformLocation)(GVar7,"MVP");
    GVar5 = (*glad_glGetAttribLocation)(GVar7,"vPos");
    (*glad_glGenBuffers)(1,&local_14c);
    (*glad_glBindBuffer)(0x8892,local_14c);
    (*glad_glBufferData)(0x8892,0x20,vertices,0x88e4);
    (*glad_glEnableVertexAttribArray)(GVar5);
    (*glad_glVertexAttribPointer)(GVar5,2,0x1406,'\0',8,(void *)0x0);
    glfwSetTime(0.0);
    dVar19 = glfwGetTime();
    while (dVar19 < 5.0) {
      glfwGetFramebufferSize(handle,&local_150,&local_154);
      local_148 = ZEXT416((uint)((float)local_150 / (float)local_154));
      (*glad_glViewport)(0,0,local_150,local_154);
      (*glad_glClear)(0x4000);
      local_b8 = 2.0 / ((float)local_148._0_4_ + (float)local_148._0_4_);
      local_b4 = 0;
      uStack_ac = 0;
      local_8c = 0;
      local_94 = 0xc000000000000000;
      local_a4._0_12_ = ZEXT812(0x3f800000);
      local_a4._12_4_ = 0;
      local_88 = -((float)local_148._0_4_ - (float)local_148._0_4_) /
                 ((float)local_148._0_4_ + (float)local_148._0_4_);
      local_84 = 0xbf80000080000000;
      local_7c = 0x3f800000;
      lVar15 = 0;
      puVar14 = local_78;
      do {
        iVar3 = (int)lVar15;
        iVar20 = (int)((ulong)lVar15 >> 0x20);
        *puVar14 = -(uint)(iVar3 == 0 && iVar20 == 0) & 0x3f800000;
        puVar14[1] = -(uint)(iVar3 == 1 && iVar20 == 0) & 0x3f800000;
        puVar14[2] = -(uint)(iVar3 == 2 && iVar20 == 0) & 0x3f800000;
        puVar14[3] = -(uint)(iVar20 == 0 && iVar3 == 3) & 0x3f800000;
        lVar15 = lVar15 + 1;
        puVar14 = puVar14 + 4;
      } while (lVar15 != 4);
      dVar19 = glfwGetTime();
      local_148._0_4_ = sinf((float)dVar19);
      local_148._4_4_ = extraout_XMM0_Db;
      local_148._8_4_ = extraout_XMM0_Dc;
      local_148._12_4_ = extraout_XMM0_Dd;
      fVar18 = cosf((float)dVar19);
      _local_138 = CONCAT44(local_148._0_4_,fVar18);
      uStack_130 = 0;
      local_128 = CONCAT44(fVar18,local_148._0_4_) ^ 0x80000000;
      auStack_120._0_12_ = ZEXT812(0);
      auStack_120._12_4_ = 0;
      local_110 = 0x3f800000;
      local_10c = auStack_120._0_4_;
      uStack_108 = auStack_120._4_8_;
      uStack_100 = 0;
      local_fc = 0x3f800000;
      pfVar13 = &local_138;
      lVar15 = 0;
      do {
        lVar16 = 0;
        puVar14 = local_78;
        do {
          fVar18 = 0.0;
          lVar17 = 0;
          do {
            fVar18 = fVar18 + (float)puVar14[lVar17] * *(float *)((long)pfVar13 + lVar17);
            lVar17 = lVar17 + 4;
          } while (lVar17 != 0x10);
          local_f8[lVar15 * 4 + lVar16] = fVar18;
          lVar16 = lVar16 + 1;
          puVar14 = puVar14 + 1;
        } while (lVar16 != 4);
        lVar15 = lVar15 + 1;
        pfVar13 = pfVar13 + 4;
      } while (lVar15 != 4);
      local_48 = local_c8;
      uStack_40 = uStack_c0;
      local_58 = local_d8;
      uStack_50 = uStack_d0;
      local_68 = local_e8;
      uStack_60 = uStack_e0;
      uStack_70 = uStack_f0;
      lVar15 = 0;
      puVar14 = local_78;
      do {
        lVar16 = 0;
        pfVar13 = &local_b8;
        do {
          fVar18 = 0.0;
          lVar17 = 0;
          do {
            fVar18 = fVar18 + pfVar13[lVar17] * *(float *)((long)puVar14 + lVar17);
            lVar17 = lVar17 + 4;
          } while (lVar17 != 0x10);
          local_f8[lVar15 * 4 + lVar16] = fVar18;
          lVar16 = lVar16 + 1;
          pfVar13 = pfVar13 + 1;
        } while (lVar16 != 4);
        lVar15 = lVar15 + 1;
        puVar14 = puVar14 + 4;
      } while (lVar15 != 4);
      uStack_108 = local_c8;
      uStack_100 = (undefined4)uStack_c0;
      local_fc = (undefined4)((ulong)uStack_c0 >> 0x20);
      local_110 = (undefined4)uStack_d0;
      local_10c = (undefined4)((ulong)uStack_d0 >> 0x20);
      local_128 = local_e8;
      uStack_130 = uStack_f0;
      (*glad_glUseProgram)(GVar7);
      (*glad_glUniformMatrix4fv)(GVar8,1,'\0',&local_138);
      (*glad_glDrawArrays)(6,0,4);
      glfwSwapBuffers(handle);
      glfwPollEvents();
      iVar3 = glfwWindowShouldClose(handle);
      if (iVar3 != 0) {
        close_window(handle);
        puts("User closed window");
        glfwTerminate();
        exit(0);
      }
      dVar19 = glfwGetTime();
    }
    puts("Closing window");
    close_window(handle);
    bVar2 = bVar2 + 1;
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
    int count = 0;
    double base;
    GLFWwindow* window;

    srand((unsigned int) time(NULL));

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);

    for (;;)
    {
        int width, height;
        GLFWmonitor* monitor = NULL;
        GLuint vertex_shader, fragment_shader, program, vertex_buffer;
        GLint mvp_location, vpos_location;

        if (count & 1)
        {
            int monitorCount;
            GLFWmonitor** monitors = glfwGetMonitors(&monitorCount);
            monitor = monitors[rand() % monitorCount];
        }

        if (monitor)
        {
            const GLFWvidmode* mode = glfwGetVideoMode(monitor);
            width = mode->width;
            height = mode->height;
        }
        else
        {
            width = 640;
            height = 480;
        }

        base = glfwGetTime();

        window = glfwCreateWindow(width, height, "Window Re-opener", monitor, NULL);
        if (!window)
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        if (monitor)
        {
            printf("Opening full screen window on monitor %s took %0.3f seconds\n",
                   glfwGetMonitorName(monitor),
                   glfwGetTime() - base);
        }
        else
        {
            printf("Opening regular window took %0.3f seconds\n",
                   glfwGetTime() - base);
        }

        glfwSetWindowCloseCallback(window, window_close_callback);
        glfwSetKeyCallback(window, key_callback);

        glfwMakeContextCurrent(window);
        gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
        glfwSwapInterval(1);

        vertex_shader = glCreateShader(GL_VERTEX_SHADER);
        glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
        glCompileShader(vertex_shader);

        fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
        glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
        glCompileShader(fragment_shader);

        program = glCreateProgram();
        glAttachShader(program, vertex_shader);
        glAttachShader(program, fragment_shader);
        glLinkProgram(program);

        mvp_location = glGetUniformLocation(program, "MVP");
        vpos_location = glGetAttribLocation(program, "vPos");

        glGenBuffers(1, &vertex_buffer);
        glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
        glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);

        glEnableVertexAttribArray(vpos_location);
        glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                              sizeof(vertices[0]), (void*) 0);

        glfwSetTime(0.0);

        while (glfwGetTime() < 5.0)
        {
            float ratio;
            int width, height;
            mat4x4 m, p, mvp;

            glfwGetFramebufferSize(window, &width, &height);
            ratio = width / (float) height;

            glViewport(0, 0, width, height);
            glClear(GL_COLOR_BUFFER_BIT);

            mat4x4_ortho(p, -ratio, ratio, -1.f, 1.f, 0.f, 1.f);

            mat4x4_identity(m);
            mat4x4_rotate_Z(m, m, (float) glfwGetTime());
            mat4x4_mul(mvp, p, m);

            glUseProgram(program);
            glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) mvp);
            glDrawArrays(GL_TRIANGLE_FAN, 0, 4);

            glfwSwapBuffers(window);
            glfwPollEvents();

            if (glfwWindowShouldClose(window))
            {
                close_window(window);
                printf("User closed window\n");

                glfwTerminate();
                exit(EXIT_SUCCESS);
            }
        }

        printf("Closing window\n");
        close_window(window);

        count++;
    }

    glfwTerminate();
}